

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl.c
# Opt level: O2

void cfl_predict_lbd_c(int16_t *ac_buf_q3,uint8_t *dst,int dst_stride,int alpha_q3,int width,
                      int height)

{
  int iVar1;
  int i;
  ulong uVar2;
  int iVar3;
  
  iVar3 = 0;
  if (width < 1) {
    width = 0;
  }
  if (height < 1) {
    height = 0;
  }
  for (; iVar3 != height; iVar3 = iVar3 + 1) {
    for (uVar2 = 0; (uint)width != uVar2; uVar2 = uVar2 + 1) {
      iVar1 = get_scaled_luma_q0(alpha_q3,ac_buf_q3[uVar2]);
      iVar1 = (uint)dst[uVar2] + iVar1;
      if (iVar1 < 1) {
        iVar1 = 0;
      }
      if (0xfe < iVar1) {
        iVar1 = 0xff;
      }
      dst[uVar2] = (uint8_t)iVar1;
    }
    dst = dst + dst_stride;
    ac_buf_q3 = ac_buf_q3 + 0x20;
  }
  return;
}

Assistant:

static inline void cfl_predict_lbd_c(const int16_t *ac_buf_q3, uint8_t *dst,
                                     int dst_stride, int alpha_q3, int width,
                                     int height) {
  for (int j = 0; j < height; j++) {
    for (int i = 0; i < width; i++) {
      dst[i] = clip_pixel(get_scaled_luma_q0(alpha_q3, ac_buf_q3[i]) + dst[i]);
    }
    dst += dst_stride;
    ac_buf_q3 += CFL_BUF_LINE;
  }
}